

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::FormatFNegativeExpSlow
          (anon_unknown_0 *this,uint128 v,int exp,FormatState *state)

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  undefined4 in_register_0000000c;
  char *pcVar4;
  int iVar5;
  size_t n;
  size_t n_00;
  ulong uVar6;
  size_t n_01;
  Func f;
  size_t digits_to_go;
  size_t local_80;
  char *local_78;
  Invoker<void,_absl::lts_20250127::Span<unsigned_int>_> local_70;
  char **local_68;
  code *local_60;
  anon_unknown_0 *local_58;
  uint64_t local_50;
  int local_48;
  
  pcVar4 = (char *)CONCAT44(in_register_0000000c,exp);
  iVar5 = (int)v.hi_;
  bVar3 = 1;
  if (*(long *)(pcVar4 + 8) == 0) {
    bVar3 = (*(byte *)(*(long *)(pcVar4 + 0x10) + 1) & 8) >> 3;
  }
  lVar1 = *(long *)(pcVar4 + 8) + 2;
  n = 1;
  if (bVar3 == 0) {
    lVar1 = 1;
  }
  uVar2 = (lVar1 + 1) - (ulong)(*pcVar4 == '\0');
  uVar6 = (ulong)*(int *)(*(long *)(pcVar4 + 0x10) + 4);
  if (((long)uVar6 < 0) || (n_01 = uVar6 - uVar2, uVar6 < uVar2 || n_01 == 0)) {
    n_01 = 0;
  }
  else {
    bVar3 = *(byte *)(*(long *)(pcVar4 + 0x10) + 1);
    if ((bVar3 & 1) == 0) {
      n_00 = n_01;
      if ((bVar3 & 0x10) != 0) {
        n = n_01 + 1;
        n_00 = 0;
      }
      n_01 = 0;
      goto LAB_00388275;
    }
  }
  n_00 = 0;
LAB_00388275:
  FormatSinkImpl::Append(*(FormatSinkImpl **)(pcVar4 + 0x18),n_00,' ');
  if (*pcVar4 != '\0') {
    FormatSinkImpl::Append(*(FormatSinkImpl **)(pcVar4 + 0x18),1,*pcVar4);
  }
  FormatSinkImpl::Append(*(FormatSinkImpl **)(pcVar4 + 0x18),n,'0');
  if ((*(long *)(pcVar4 + 8) != 0) || ((*(byte *)(*(long *)(pcVar4 + 0x10) + 1) & 8) != 0)) {
    FormatSinkImpl::Append(*(FormatSinkImpl **)(pcVar4 + 0x18),1,'.');
  }
  local_80 = *(size_t *)(pcVar4 + 8);
  local_70 = (Invoker<void,_absl::lts_20250127::Span<unsigned_int>_>)&local_80;
  local_78 = pcVar4;
  if (0x407d < iVar5) {
    __assert_fail("-exp >= Limits::min_exponent - 128",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                  ,0xff,
                  "static void absl::str_format_internal::(anonymous namespace)::FractionalDigitGenerator::RunConversion(uint128, int, absl::FunctionRef<void (FractionalDigitGenerator)>)"
                 );
  }
  local_68 = &local_78;
  local_60 = functional_internal::
             InvokeObject<absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatFNegativeExpSlow(absl::lts_20250127::uint128,int,absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatState_const&)::__0,void,absl::lts_20250127::str_format_internal::(anonymous_namespace)::FractionalDigitGenerator>
  ;
  f.invoker_ = local_70;
  f.ptr_.fun = functional_internal::
               InvokeObject<absl::lts_20250127::str_format_internal::(anonymous_namespace)::FractionalDigitGenerator::RunConversion(absl::lts_20250127::uint128,int,absl::lts_20250127::FunctionRef<void(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FractionalDigitGenerator)>)::_lambda(absl::lts_20250127::Span<unsigned_int>)_1_,void,absl::lts_20250127::Span<unsigned_int>>
  ;
  local_58 = this;
  local_50 = v.lo_;
  local_48 = iVar5;
  StackArray::RunWithCapacity((StackArray *)(ulong)(iVar5 + 0x5fU >> 5),(size_t)&local_68,f);
  FormatSinkImpl::Append(*(FormatSinkImpl **)(pcVar4 + 0x18),local_80,'0');
  FormatSinkImpl::Append(*(FormatSinkImpl **)(pcVar4 + 0x18),n_01,' ');
  return;
}

Assistant:

void FormatFNegativeExpSlow(uint128 v, int exp, const FormatState &state) {
  const size_t total_digits =
      /* 0 */ 1 + (state.ShouldPrintDot() ? state.precision + 1 : 0);
  auto padding =
      ExtraWidthToPadding(total_digits + (state.sign_char ? 1 : 0), state);
  padding.zeros += 1;
  state.sink->Append(padding.left_spaces, ' ');
  if (state.sign_char != '\0') state.sink->Append(1, state.sign_char);
  state.sink->Append(padding.zeros, '0');

  if (state.ShouldPrintDot()) state.sink->Append(1, '.');

  // Print digits
  size_t digits_to_go = state.precision;

  FractionalDigitGenerator::RunConversion(
      v, exp, [&](FractionalDigitGenerator digit_gen) {
        // There are no digits to print here.
        if (state.precision == 0) return;

        // We go one digit at a time, while keeping track of runs of nines.
        // The runs of nines are used to perform rounding when necessary.

        while (digits_to_go > 0 && digit_gen.HasMoreDigits()) {
          auto digits = digit_gen.GetDigits();

          // Now we have a digit and a run of nines.
          // See if we can print them all.
          if (digits.num_nines + 1 < digits_to_go) {
            // We don't have to round yet, so print them.
            state.sink->Append(1, digits.digit_before_nine + '0');
            state.sink->Append(digits.num_nines, '9');
            digits_to_go -= digits.num_nines + 1;

          } else {
            // We can't print all the nines, see where we have to truncate.

            bool round_up = false;
            if (digits.num_nines + 1 > digits_to_go) {
              // We round up at a nine. No need to print them.
              round_up = true;
            } else {
              // We can fit all the nines, but truncate just after it.
              if (digit_gen.IsGreaterThanHalf()) {
                round_up = true;
              } else if (digit_gen.IsExactlyHalf()) {
                // Round to even
                round_up =
                    digits.num_nines != 0 || digits.digit_before_nine % 2 == 1;
              }
            }

            if (round_up) {
              state.sink->Append(1, digits.digit_before_nine + '1');
              --digits_to_go;
              // The rest will be zeros.
            } else {
              state.sink->Append(1, digits.digit_before_nine + '0');
              state.sink->Append(digits_to_go - 1, '9');
              digits_to_go = 0;
            }
            return;
          }
        }
      });

  state.sink->Append(digits_to_go, '0');
  state.sink->Append(padding.right_spaces, ' ');
}